

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pAngle.cpp
# Opt level: O2

void __thiscall
OpenMD::pAngle::pAngle
          (pAngle *this,SimInfo *info,string *filename,string *sele1,int seleOffset,int nthetabins)

{
  SelectionEvaluator *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  StaticAnalyser::StaticAnalyser(&this->super_StaticAnalyser,info,filename,nthetabins);
  (this->super_StaticAnalyser)._vptr_StaticAnalyser = (_func_int **)&PTR__pAngle_002ee200;
  this->doVect_ = false;
  this->doOffset_ = true;
  this->doOffset2_ = false;
  std::__cxx11::string::string((string *)&this->selectionScript1_,(string *)sele1);
  (this->selectionScript2_)._M_dataplus._M_p = (pointer)&(this->selectionScript2_).field_2;
  (this->selectionScript2_)._M_string_length = 0;
  (this->selectionScript2_).field_2._M_local_buf[0] = '\0';
  SelectionManager::SelectionManager(&this->seleMan1_,info);
  SelectionManager::SelectionManager(&this->seleMan2_,info);
  this_00 = &this->evaluator1_;
  SelectionEvaluator::SelectionEvaluator(this_00,info);
  SelectionEvaluator::SelectionEvaluator(&this->evaluator2_,info);
  this->seleOffset_ = seleOffset;
  this->nThetaBins_ = nthetabins;
  (this->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->histogram_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->histogram_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->histogram_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  getPrefix(&local_50,filename);
  std::operator+(&local_70,&local_50,".pAngle");
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).outputFilename_);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  SelectionEvaluator::loadScriptString(this_00,sele1);
  if ((this->evaluator1_).isDynamic_ == false) {
    SelectionEvaluator::evaluate((SelectionSet *)&local_70,this_00);
    SelectionManager::setSelectionSet(&this->seleMan1_,(SelectionSet *)&local_70);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_70);
  }
  std::vector<int,_std::allocator<int>_>::resize(&this->count_,(long)this->nThetaBins_);
  std::vector<double,_std::allocator<double>_>::resize(&this->histogram_,(long)this->nThetaBins_);
  return;
}

Assistant:

pAngle::pAngle(SimInfo* info, const std::string& filename,
                 const std::string& sele1, int seleOffset, int nthetabins) :
      StaticAnalyser(info, filename, nthetabins),
      doVect_(false), doOffset_(true), doOffset2_(false),
      selectionScript1_(sele1), seleMan1_(info), seleMan2_(info),
      evaluator1_(info), evaluator2_(info), seleOffset_(seleOffset),
      nThetaBins_(nthetabins) {
    setOutputName(getPrefix(filename) + ".pAngle");

    evaluator1_.loadScriptString(sele1);
    if (!evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
    }

    count_.resize(nThetaBins_);
    histogram_.resize(nThetaBins_);
  }